

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Publication * __thiscall
helics::ValueFederateManager::registerPublication
          (ValueFederateManager *this,string_view key,string_view type,string_view units)

{
  string_view typeName;
  Publication *pPVar1;
  RegistrationFailure *this_00;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  string_view searchValue1;
  string_view message;
  optional<unsigned_long> oVar5;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  InterfaceHandle coreID;
  string_view key_local;
  string_view local_48;
  handle pubHandle;
  
  pcVar2 = key._M_str;
  sVar4 = key._M_len;
  key_local._M_len = sVar4;
  key_local._M_str = pcVar2;
  if (this->useJsonSerialization == false) {
    typeName._M_len._4_4_ = in_stack_ffffffffffffff94;
    typeName._M_len._0_4_ = in_stack_ffffffffffffff90;
    typeName._M_str = in_stack_ffffffffffffff98;
    local_48 = getCleanedTypeName(typeName);
  }
  else {
    local_48._M_str = "json";
    local_48._M_len = 4;
  }
  coreID.hid = (*this->coreObject->_vptr_Core[0x24])
                         (this->coreObject,(ulong)(uint)(this->fedID).fid,sVar4,pcVar2,
                          local_48._M_len,local_48._M_str,
                          CONCAT44(units._M_len._4_4_,(undefined4)units._M_len),units._M_str._0_4_);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&pubHandle,&this->publications);
  if (key_local._M_len == 0) {
    oVar5 = gmlc::containers::
            DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                        *)pubHandle.data,&coreID,&this->fed,&coreID,&key_local,&local_48,&units);
    uVar3 = oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
  }
  else {
    searchValue1._M_str = key_local._M_str;
    searchValue1._M_len = key_local._M_len;
    oVar5 = gmlc::containers::
            DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                        *)pubHandle.data,searchValue1,&coreID,&this->fed,&coreID,&key_local,
                       &local_48,&units);
    uVar3 = oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
  }
  if ((uVar3 & 1) != 0) {
    pPVar1 = gmlc::containers::
             StableBlockVector<helics::Publication,_5U,_std::allocator<helics::Publication>_>::back
                       (&(pubHandle.data)->dataStorage);
    std::unique_lock<std::mutex>::~unique_lock(&pubHandle.m_handle_lock);
    return pPVar1;
  }
  this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register Publication";
  message._M_len = 0x1e;
  RegistrationFailure::RegistrationFailure(this_00,message);
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Publication& ValueFederateManager::registerPublication(std::string_view key,
                                                       std::string_view type,
                                                       std::string_view units)
{
    type = useJsonSerialization ? jsonStringType : getCleanedTypeName(type);
    auto coreID = coreObject->registerPublication(fedID, key, type, units);

    auto pubHandle = publications.lock();
    decltype(pubHandle->insert(key, coreID, fed, coreID, key, type, units)) active;
    if (!key.empty()) {
        active = pubHandle->insert(key, coreID, fed, coreID, key, type, units);
    } else {
        active = pubHandle->insert(no_search, coreID, fed, coreID, key, type, units);
    }

    if (active) {
        return pubHandle->back();
    }
    throw(RegistrationFailure("Unable to register Publication"));
}